

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O2

void ImageToPOT(Image *image,Color fill)

{
  float fVar1;
  float fVar2;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    fVar1 = logf((float)image->width);
    fVar1 = ceilf(fVar1 / 0.6931472);
    fVar1 = exp2f(fVar1);
    fVar2 = logf((float)image->height);
    fVar2 = ceilf(fVar2 / 0.6931472);
    fVar2 = exp2f(fVar2);
    if ((image->width != (int)fVar1) || (image->height != (int)fVar2)) {
      ImageResizeCanvas(image,(int)fVar1,(int)fVar2,0,0,fill);
      return;
    }
  }
  return;
}

Assistant:

void ImageToPOT(Image *image, Color fill)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    // Calculate next power-of-two values
    // NOTE: Just add the required amount of pixels at the right and bottom sides of image...
    int potWidth = (int)powf(2, ceilf(logf((float)image->width)/logf(2)));
    int potHeight = (int)powf(2, ceilf(logf((float)image->height)/logf(2)));

    // Check if POT texture generation is required (if texture is not already POT)
    if ((potWidth != image->width) || (potHeight != image->height)) ImageResizeCanvas(image, potWidth, potHeight, 0, 0, fill);
}